

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

LayoutBindingTestResult * __thiscall
glcts::AtomicCounterLayoutBindingCase::binding_examples_many_bindings
          (LayoutBindingTestResult *__return_storage_ptr__,AtomicCounterLayoutBindingCase *this)

{
  eStageType eVar1;
  LayoutBindingTestResult *pLVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  LayoutBindingProgram *this_00;
  mapped_type_conflict *pmVar6;
  undefined4 extraout_var_01;
  _func_int **pp_Var7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  ulong uVar11;
  StringIntMap offsets;
  int local_300;
  String local_2f8;
  int local_2d4;
  int max_bindings;
  allocator<char> local_2ca;
  allocator<char> local_2c9;
  LayoutBindingTestResult *local_2c8;
  IProgramContextSupplier *local_2c0;
  StringVector list_1;
  StringVector list;
  IntVector expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  StringStream s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined4 extraout_var_00;
  
  max_bindings = 0;
  eVar1 = (this->super_LayoutBindingBaseCase).m_stage.type;
  iVar4 = (*((this->super_LayoutBindingBaseCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  uVar8 = 0x8264;
  if (eVar1 == FragmentShader) {
    uVar8 = 0x92d0;
  }
  uVar9 = 0x92cc;
  if (eVar1 != VertexShader) {
    uVar9 = uVar8;
  }
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0x868))(uVar9,&max_bindings);
  StringStream::StringStream(&s);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_2f8,this,0);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1b])(&offsets,this,&local_2f8);
  poVar5 = std::operator<<((ostream *)&s,(string *)&offsets);
  std::operator<<(poVar5,";\n");
  std::__cxx11::string::~string((string *)&offsets);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::stringbuf::str();
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",(String *)&offsets);
  std::__cxx11::string::~string((string *)&offsets);
  StringStream::reset(&s);
  std::operator<<((ostream *)&s,"layout(binding=2, offset=4) uniform atomic_uint;\n");
  poVar5 = std::operator<<((ostream *)&s,"layout(binding=2) uniform atomic_uint ");
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&offsets,this,0);
  poVar5 = std::operator<<(poVar5,(string *)&offsets);
  std::operator<<(poVar5,";\n");
  std::__cxx11::string::~string((string *)&offsets);
  std::__cxx11::stringbuf::str();
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)&offsets);
  std::__cxx11::string::~string((string *)&offsets);
  LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
  local_2c0 = &(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier;
  iVar4 = (*(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier.
            _vptr_IProgramContextSupplier[6])();
  this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_00,iVar4);
  bVar3 = LayoutBindingProgram::compiledAndLinked(this_00);
  if (bVar3) {
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&offsets,this,0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offsets);
    std::__cxx11::string::~string((string *)&offsets);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_220,&list);
    (*this_00->_vptr_LayoutBindingProgram[5])(&offsets,this_00,&local_220);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_220);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&offsets,list.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    if (*pmVar6 == 4) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&offsets._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&list);
      (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
      StringStream::~StringStream(&s);
      if (max_bindings < 2) {
LAB_00bf7d1f:
        StringStream::StringStream(&s);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&local_2f8,this,0);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x1b])(&offsets,this,&local_2f8);
        poVar5 = std::operator<<((ostream *)&s,(string *)&offsets);
        std::operator<<(poVar5,";\n");
        std::__cxx11::string::~string((string *)&offsets);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::stringbuf::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",(String *)&offsets);
        std::__cxx11::string::~string((string *)&offsets);
        StringStream::reset(&s);
        std::operator<<((ostream *)&s,"layout(binding=2, offset=4) uniform atomic_uint;\n");
        poVar5 = std::operator<<((ostream *)&s,"layout(offset=8) uniform atomic_uint ");
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&offsets,this,0);
        poVar5 = std::operator<<(poVar5,(string *)&offsets);
        std::operator<<(poVar5,";\n");
        std::__cxx11::string::~string((string *)&offsets);
        std::__cxx11::stringbuf::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)&offsets);
        std::__cxx11::string::~string((string *)&offsets);
        LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
        iVar4 = (*local_2c0->_vptr_IProgramContextSupplier[6])();
        this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_02,iVar4);
        bVar3 = LayoutBindingProgram::compiledAndLinked(this_00);
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&offsets,"should not compile",(allocator<char> *)&local_2f8);
          __return_storage_ptr__->m_passed = false;
          __return_storage_ptr__->m_notRunForThisContext = false;
          std::__cxx11::string::string
                    ((string *)&__return_storage_ptr__->m_reason,(string *)&offsets);
        }
        else {
          (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
          StringStream::~StringStream(&s);
          StringStream::StringStream(&s);
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x17])(&local_2f8,this,0);
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x1b])(&offsets,this,&local_2f8);
          poVar5 = std::operator<<((ostream *)&s,(string *)&offsets);
          std::operator<<(poVar5,";\n");
          std::__cxx11::string::~string((string *)&offsets);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::stringbuf::str();
          LayoutBindingBaseCase::setTemplateParam
                    (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",(String *)&offsets);
          std::__cxx11::string::~string((string *)&offsets);
          StringStream::reset(&s);
          poVar5 = std::operator<<((ostream *)&s,"layout(offset=4) uniform atomic_uint ");
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x17])(&offsets,this,0);
          poVar5 = std::operator<<(poVar5,(string *)&offsets);
          std::operator<<(poVar5,";\n");
          std::__cxx11::string::~string((string *)&offsets);
          std::__cxx11::stringbuf::str();
          LayoutBindingBaseCase::setTemplateParam
                    (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)&offsets);
          std::__cxx11::string::~string((string *)&offsets);
          LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
          iVar4 = (*local_2c0->_vptr_IProgramContextSupplier[6])();
          this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_03,iVar4);
          bVar3 = LayoutBindingProgram::compiledAndLinked(this_00);
          if (!bVar3) {
            local_2c8 = __return_storage_ptr__;
            (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
            StringStream::~StringStream(&s);
            if (1 < max_bindings) {
              local_300 = 2;
              while (local_300 != 0) {
                local_2d4 = local_300 + -1;
                StringStream::StringStream(&s);
                (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[0x17])(&local_2f8,this,0);
                (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[0x1b])((String *)&offsets,this,&local_2f8);
                poVar5 = std::operator<<((ostream *)&s,(string *)&offsets);
                std::operator<<(poVar5,";\n");
                std::__cxx11::string::~string((string *)&offsets);
                std::__cxx11::string::~string((string *)&local_2f8);
                poVar5 = std::operator<<((ostream *)&s,"+");
                (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[0x17])(&local_2f8,this,1);
                (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[0x1b])((String *)&offsets,this,&local_2f8);
                poVar5 = std::operator<<(poVar5,(string *)&offsets);
                std::operator<<(poVar5,";\n");
                std::__cxx11::string::~string((string *)&offsets);
                std::__cxx11::string::~string((string *)&local_2f8);
                if (local_300 != 2) {
                  poVar5 = std::operator<<((ostream *)&s,"+");
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x17])(&local_2f8,this,2);
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x1b])((String *)&offsets,this,&local_2f8);
                  poVar5 = std::operator<<(poVar5,(string *)&offsets);
                  std::operator<<(poVar5,";\n");
                  std::__cxx11::string::~string((string *)&offsets);
                  std::__cxx11::string::~string((string *)&local_2f8);
                }
                std::__cxx11::stringbuf::str();
                LayoutBindingBaseCase::setTemplateParam
                          (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",(String *)&offsets);
                std::__cxx11::string::~string((string *)&offsets);
                StringStream::reset(&s);
                poVar5 = std::operator<<((ostream *)&s,
                                         "layout(binding=1, offset=0) uniform atomic_uint ");
                (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[0x17])((String *)&offsets,this,0);
                poVar5 = std::operator<<(poVar5,(string *)&offsets);
                std::operator<<(poVar5,";\n");
                std::__cxx11::string::~string((string *)&offsets);
                poVar5 = std::operator<<((ostream *)&s,
                                         "layout(binding=2, offset=0) uniform atomic_uint ");
                (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[0x17])((String *)&offsets,this,1);
                poVar5 = std::operator<<(poVar5,(string *)&offsets);
                std::operator<<(poVar5,";\n");
                std::__cxx11::string::~string((string *)&offsets);
                if (local_300 != 2) {
                  poVar5 = std::operator<<((ostream *)&s,
                                           "layout(binding=1, offset=0) uniform atomic_uint ");
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x17])((String *)&offsets,this,2);
                  poVar5 = std::operator<<(poVar5,(string *)&offsets);
                  std::operator<<(poVar5,";\n");
                  std::__cxx11::string::~string((string *)&offsets);
                }
                std::__cxx11::stringbuf::str();
                LayoutBindingBaseCase::setTemplateParam
                          (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)&offsets);
                std::__cxx11::string::~string((string *)&offsets);
                LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
                iVar4 = (*local_2c0->_vptr_IProgramContextSupplier[6])();
                this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_04,iVar4);
                bVar3 = LayoutBindingProgram::compiledAndLinked(this_00);
                if (local_300 == 2) {
                  if (!bVar3) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&offsets,"should not compile",(allocator<char> *)&local_2f8
                              );
                    __return_storage_ptr__ = local_2c8;
                    local_2c8->m_passed = false;
                    local_2c8->m_notRunForThisContext = false;
                    std::__cxx11::string::string((string *)&local_2c8->m_reason,(string *)&offsets);
                    goto LAB_00bf8032;
                  }
                }
                else if (bVar3) {
                  LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&offsets,this_00,false);
                  __return_storage_ptr__ = local_2c8;
                  local_2c8->m_passed = true;
                  local_2c8->m_notRunForThisContext = false;
                  std::__cxx11::string::string((string *)&local_2c8->m_reason,(string *)&offsets);
                  goto LAB_00bf8032;
                }
                (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
                StringStream::~StringStream(&s);
                local_300 = local_2d4;
              }
              if (1 < max_bindings) {
                local_300 = 2;
                while (local_300 != 0) {
                  local_2d4 = local_300 + -1;
                  StringStream::StringStream(&s);
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x17])(&local_2f8,this,0);
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x1b])((String *)&offsets,this,&local_2f8);
                  poVar5 = std::operator<<((ostream *)&s,(string *)&offsets);
                  std::operator<<(poVar5,";\n");
                  std::__cxx11::string::~string((string *)&offsets);
                  std::__cxx11::string::~string((string *)&local_2f8);
                  poVar5 = std::operator<<((ostream *)&s,"+");
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x17])(&local_2f8,this,1);
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x1b])((String *)&offsets,this,&local_2f8);
                  poVar5 = std::operator<<(poVar5,(string *)&offsets);
                  std::operator<<(poVar5,";\n");
                  std::__cxx11::string::~string((string *)&offsets);
                  std::__cxx11::string::~string((string *)&local_2f8);
                  if (local_300 != 2) {
                    poVar5 = std::operator<<((ostream *)&s,"+");
                    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[0x17])(&local_2f8,this,2);
                    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[0x1b])((String *)&offsets,this,&local_2f8);
                    poVar5 = std::operator<<(poVar5,(string *)&offsets);
                    std::operator<<(poVar5,";\n");
                    std::__cxx11::string::~string((string *)&offsets);
                    std::__cxx11::string::~string((string *)&local_2f8);
                  }
                  std::__cxx11::stringbuf::str();
                  LayoutBindingBaseCase::setTemplateParam
                            (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",(String *)&offsets)
                  ;
                  std::__cxx11::string::~string((string *)&offsets);
                  StringStream::reset(&s);
                  poVar5 = std::operator<<((ostream *)&s,
                                           "layout(binding=1, offset=0) uniform atomic_uint ");
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x17])((String *)&offsets,this,0);
                  poVar5 = std::operator<<(poVar5,(string *)&offsets);
                  std::operator<<(poVar5,";\n");
                  std::__cxx11::string::~string((string *)&offsets);
                  poVar5 = std::operator<<((ostream *)&s,
                                           "layout(binding=2, offset=0) uniform atomic_uint ");
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x17])((String *)&offsets,this,1);
                  poVar5 = std::operator<<(poVar5,(string *)&offsets);
                  std::operator<<(poVar5,";\n");
                  std::__cxx11::string::~string((string *)&offsets);
                  if (local_300 != 2) {
                    poVar5 = std::operator<<((ostream *)&s,
                                             "layout(binding=1, offset=2) uniform atomic_uint ");
                    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[0x17])((String *)&offsets,this,2);
                    poVar5 = std::operator<<(poVar5,(string *)&offsets);
                    std::operator<<(poVar5,";\n");
                    std::__cxx11::string::~string((string *)&offsets);
                  }
                  std::__cxx11::stringbuf::str();
                  LayoutBindingBaseCase::setTemplateParam
                            (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)&offsets);
                  std::__cxx11::string::~string((string *)&offsets);
                  LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
                  iVar4 = (*local_2c0->_vptr_IProgramContextSupplier[6])();
                  this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_05,iVar4);
                  bVar3 = LayoutBindingProgram::compiledAndLinked(this_00);
                  if (local_300 == 2) {
                    if (!bVar3) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&offsets,"should not compile",
                                 (allocator<char> *)&local_2f8);
                      __return_storage_ptr__ = local_2c8;
                      local_2c8->m_passed = false;
                      local_2c8->m_notRunForThisContext = false;
                      std::__cxx11::string::string
                                ((string *)&local_2c8->m_reason,(string *)&offsets);
                      goto LAB_00bf8032;
                    }
                  }
                  else if (bVar3) {
                    LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&offsets,this_00,false);
                    __return_storage_ptr__ = local_2c8;
                    local_2c8->m_passed = true;
                    local_2c8->m_notRunForThisContext = false;
                    std::__cxx11::string::string((string *)&local_2c8->m_reason,(string *)&offsets);
                    goto LAB_00bf8032;
                  }
                  (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
                  StringStream::~StringStream(&s);
                  local_300 = local_2d4;
                }
              }
            }
            pLVar2 = local_2c8;
            s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream =
                 (_func_int **)
                 &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x10;
            s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
            s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
            local_2c8->m_passed = true;
            local_2c8->m_notRunForThisContext = false;
            std::__cxx11::string::string((string *)&local_2c8->m_reason,(string *)&s);
            std::__cxx11::string::~string((string *)&s);
            return pLVar2;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&offsets,"should not compile",(allocator<char> *)&local_2f8);
          __return_storage_ptr__->m_passed = false;
          __return_storage_ptr__->m_notRunForThisContext = false;
          std::__cxx11::string::string
                    ((string *)&__return_storage_ptr__->m_reason,(string *)&offsets);
        }
LAB_00bf8032:
        std::__cxx11::string::~string((string *)&offsets);
      }
      else {
        StringStream::StringStream(&s);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&local_2f8,this,0);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x1b])(&offsets,this,&local_2f8);
        poVar5 = std::operator<<((ostream *)&s,(string *)&offsets);
        std::operator<<(poVar5,";\n");
        std::__cxx11::string::~string((string *)&offsets);
        std::__cxx11::string::~string((string *)&local_2f8);
        poVar5 = std::operator<<((ostream *)&s,"+");
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&local_2f8,this,1);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x1b])(&offsets,this,&local_2f8);
        poVar5 = std::operator<<(poVar5,(string *)&offsets);
        std::operator<<(poVar5,";\n");
        std::__cxx11::string::~string((string *)&offsets);
        std::__cxx11::string::~string((string *)&local_2f8);
        poVar5 = std::operator<<((ostream *)&s,"+");
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&local_2f8,this,2);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x1b])(&offsets,this,&local_2f8);
        poVar5 = std::operator<<(poVar5,(string *)&offsets);
        std::operator<<(poVar5,";\n");
        std::__cxx11::string::~string((string *)&offsets);
        std::__cxx11::string::~string((string *)&local_2f8);
        poVar5 = std::operator<<((ostream *)&s,"+");
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&local_2f8,this,3);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x1b])(&offsets,this,&local_2f8);
        poVar5 = std::operator<<(poVar5,(string *)&offsets);
        std::operator<<(poVar5,";\n");
        std::__cxx11::string::~string((string *)&offsets);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::stringbuf::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",(String *)&offsets);
        std::__cxx11::string::~string((string *)&offsets);
        StringStream::reset(&s);
        poVar5 = std::operator<<((ostream *)&s,"layout(binding=3, offset=4) uniform atomic_uint ");
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&offsets,this,0);
        poVar5 = std::operator<<(poVar5,(string *)&offsets);
        std::operator<<(poVar5,";\n");
        std::__cxx11::string::~string((string *)&offsets);
        poVar5 = std::operator<<((ostream *)&s,"layout(binding=2) uniform atomic_uint ");
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&offsets,this,1);
        poVar5 = std::operator<<(poVar5,(string *)&offsets);
        std::operator<<(poVar5,";\n");
        std::__cxx11::string::~string((string *)&offsets);
        poVar5 = std::operator<<((ostream *)&s,"layout(binding=3) uniform atomic_uint ");
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&offsets,this,2);
        poVar5 = std::operator<<(poVar5,(string *)&offsets);
        std::operator<<(poVar5,";\n");
        std::__cxx11::string::~string((string *)&offsets);
        poVar5 = std::operator<<((ostream *)&s,"layout(binding=2) uniform atomic_uint ");
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&offsets,this,3);
        poVar5 = std::operator<<(poVar5,(string *)&offsets);
        std::operator<<(poVar5,";\n");
        std::__cxx11::string::~string((string *)&offsets);
        std::__cxx11::stringbuf::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)&offsets);
        std::__cxx11::string::~string((string *)&offsets);
        LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
        iVar4 = (*local_2c0->_vptr_IProgramContextSupplier[6])();
        this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar4);
        bVar3 = LayoutBindingProgram::compiledAndLinked(this_00);
        if (!bVar3) {
          LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&offsets,this_00,false);
          __return_storage_ptr__->m_passed = false;
          __return_storage_ptr__->m_notRunForThisContext = false;
          std::__cxx11::string::string
                    ((string *)&__return_storage_ptr__->m_reason,(string *)&offsets);
          std::__cxx11::string::~string((string *)&offsets);
          pp_Var7 = this_00->_vptr_LayoutBindingProgram;
          goto LAB_00bf7c86;
        }
        list_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        list_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        list_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&offsets,this,0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offsets);
        std::__cxx11::string::~string((string *)&offsets);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&offsets,this,1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offsets);
        std::__cxx11::string::~string((string *)&offsets);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&offsets,this,2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offsets);
        std::__cxx11::string::~string((string *)&offsets);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&offsets,this,3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offsets);
        std::__cxx11::string::~string((string *)&offsets);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_238,&list_1);
        (*this_00->_vptr_LayoutBindingProgram[5])(&offsets,this_00,&local_238);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_238);
        expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_2f8._M_dataplus._M_p._0_4_ = 4;
        std::vector<int,_std::allocator<int>_>::_M_insert_rval
                  (&expected,(const_iterator)0x0,(value_type_conflict1 *)&local_2f8);
        local_2f8._M_dataplus._M_p._0_4_ = 0;
        std::vector<int,_std::allocator<int>_>::_M_insert_rval
                  (&expected,
                   (const_iterator)
                   expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_2f8);
        local_2f8._M_dataplus._M_p._0_4_ = 8;
        std::vector<int,_std::allocator<int>_>::_M_insert_rval
                  (&expected,
                   (const_iterator)
                   expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_2f8);
        local_2f8._M_dataplus._M_p._0_4_ = 4;
        std::vector<int,_std::allocator<int>_>::_M_insert_rval
                  (&expected,
                   (const_iterator)
                   expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_2f8);
        uVar10 = 0;
        do {
          uVar11 = (ulong)uVar10;
          if ((ulong)((long)list_1.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)list_1.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar11) {
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&expected.super__Vector_base<int,_std::allocator<int>_>);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~_Rb_tree(&offsets._M_t);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&list_1);
            (*this_00->_vptr_LayoutBindingProgram[1])();
            StringStream::~StringStream(&s);
            goto LAB_00bf7d1f;
          }
          iVar4 = expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11];
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](&offsets,list_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar11);
          uVar10 = uVar10 + 1;
        } while (iVar4 == *pmVar6);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,"offset of",&local_2c9);
        std::__cxx11::string::string
                  ((string *)&local_50,
                   (string *)
                   (list_1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar11));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&list,
                       &local_208,&local_50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"did not match requested",&local_2ca);
        std::operator+(&local_258,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&list,
                       &local_70);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&offsets,list_1.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar11);
        LayoutBindingBaseCase::generateLog<int,int>
                  (&local_2f8,&this->super_LayoutBindingBaseCase,&local_258,*pmVar6,4);
        __return_storage_ptr__->m_passed = false;
        __return_storage_ptr__->m_notRunForThisContext = false;
        std::__cxx11::string::string
                  ((string *)&__return_storage_ptr__->m_reason,(string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&list);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_208);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&expected.super__Vector_base<int,_std::allocator<int>_>);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree(&offsets._M_t);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&list_1);
      }
      pp_Var7 = this_00->_vptr_LayoutBindingProgram;
      goto LAB_00bf7c86;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"offset did not match requested",(allocator<char> *)&local_208);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&offsets,list.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    LayoutBindingBaseCase::generateLog<int,int>
              (&local_2f8,&this->super_LayoutBindingBaseCase,&local_258,*pmVar6,1);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_258);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&offsets._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&list);
  }
  else {
    LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&offsets,this_00,false);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)&offsets);
    std::__cxx11::string::~string((string *)&offsets);
  }
  pp_Var7 = this_00->_vptr_LayoutBindingProgram;
LAB_00bf7c86:
  (*pp_Var7[1])(this_00);
  StringStream::~StringStream(&s);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult binding_examples_many_bindings(void)
	{
		int max_bindings = 0;

		if (isStage(VertexShader))
		{
			gl().getIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, &max_bindings);
		}
		else if (isStage(FragmentShader))
		{
			gl().getIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, &max_bindings);
		}
		else
		{
			gl().getIntegerv(GL_MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS, &max_bindings);
		}

		// example 1 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=2, offset=4) uniform atomic_uint;\n";
			s << "layout(binding=2) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector list;
			list.push_back(getDefaultUniformName());

			StringIntMap offsets = program->getOffsets(list);
			passed &= (4 == offsets[list[0]]);
			if (!passed)
			{
				return LayoutBindingTestResult(
					passed, generateLog(String("offset did not match requested"), offsets[list[0]], 1));
			}
		}

		// example 2 in atomic counter CTS spec ac-binding-examples
		if (max_bindings >= 2)
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(2)) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(3)) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=3, offset=4) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			s << "layout(binding=2) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
			s << "layout(binding=3) uniform atomic_uint " << getDefaultUniformName(2) << ";\n";
			s << "layout(binding=2) uniform atomic_uint " << getDefaultUniformName(3) << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector list;
			list.push_back(getDefaultUniformName());
			list.push_back(getDefaultUniformName(1));
			list.push_back(getDefaultUniformName(2));
			list.push_back(getDefaultUniformName(3));

			StringIntMap offsets = program->getOffsets(list);
			IntVector	expected;
			expected.insert(expected.end(), 4);
			expected.insert(expected.end(), 0);
			expected.insert(expected.end(), 8);
			expected.insert(expected.end(), 4);
			for (unsigned int idx = 0; idx < list.size(); idx++)
			{
				passed &= (expected[idx] == offsets[list[idx]]);
				if (!passed)
				{
					return LayoutBindingTestResult(
						passed, generateLog(String("offset of") + String(list[idx]) + String("did not match requested"),
											offsets[list[idx]], 4));
				}
			}
		}

		// example 3 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=2, offset=4) uniform atomic_uint;\n";
			s << "layout(offset=8) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (passed)
			{
				return LayoutBindingTestResult(!passed, String("should not compile"));
			}
		}

		// example 4 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(offset=4) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (passed)
			{
				return LayoutBindingTestResult(!passed, String("should not compile"));
			}
		}

		// example 5 in atomic counter CTS spec ac-binding-examples
		// first check working example, then amend it with an error
		if (max_bindings >= 2)
		{
			for (int pass = 0; pass < 2; pass++)
			{
				bool passed = true;

				StringStream s;
				s << buildAccess(getDefaultUniformName()) << ";\n";
				s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
				if (pass)
					s << "+" << buildAccess(getDefaultUniformName(2)) << ";\n";
				setTemplateParam("UNIFORM_ACCESS", s.str());

				s.reset();
				s << "layout(binding=1, offset=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
				s << "layout(binding=2, offset=0) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
				if (pass)
					s << "layout(binding=1, offset=0) uniform atomic_uint " << getDefaultUniformName(2) << ";\n";
				setTemplateParam("UNIFORM_DECL", s.str());
				updateTemplate();

				LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
				passed &= program->compiledAndLinked();
				if (pass != 0)
				{
					if (passed)
					{
						return LayoutBindingTestResult(passed, program->getErrorLog());
					}
				}
				else
				{
					if (!passed)
					{
						return LayoutBindingTestResult(passed, String("should not compile"));
					}
				}
			}
		}

		// example 6 in atomic counter CTS spec ac-binding-examples
		// first check working example, then amend it with an error
		if (max_bindings >= 2)
		{
			for (int pass = 0; pass < 2; pass++)
			{
				bool passed = true;

				StringStream s;
				s << buildAccess(getDefaultUniformName()) << ";\n";
				s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
				if (pass)
					s << "+" << buildAccess(getDefaultUniformName(2)) << ";\n";
				setTemplateParam("UNIFORM_ACCESS", s.str());

				s.reset();
				s << "layout(binding=1, offset=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
				s << "layout(binding=2, offset=0) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
				if (pass)
					s << "layout(binding=1, offset=2) uniform atomic_uint " << getDefaultUniformName(2) << ";\n";
				setTemplateParam("UNIFORM_DECL", s.str());
				updateTemplate();

				LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
				passed &= program->compiledAndLinked();
				if (pass != 0)
				{
					if (passed)
					{
						return LayoutBindingTestResult(passed, program->getErrorLog());
					}
				}
				else
				{
					if (!passed)
					{
						return LayoutBindingTestResult(passed, String("should not compile"));
					}
				}
			}
		}

		return true;
	}